

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseCharRef(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  char *msg;
  xmlChar *pxVar3;
  int iVar4;
  uint int1;
  
  pxVar2 = ctxt->input;
  pxVar3 = pxVar2->cur;
  if (*pxVar3 == '&') {
    if (pxVar3[1] != '#') {
      pxVar2->cur = pxVar3 + 1;
      pxVar2->col = pxVar2->col + 1;
      if (pxVar3[1] == '\0') {
        xmlParserGrow(ctxt);
      }
      goto LAB_00130099;
    }
    if (pxVar3[2] == 'x') {
      pxVar2->cur = pxVar3 + 3;
      pxVar2->col = pxVar2->col + 3;
      if (pxVar3[3] == '\0') {
        xmlParserGrow(ctxt);
        pxVar2 = ctxt->input;
      }
      if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar2 = ctxt->input;
      }
      pxVar3 = pxVar2->cur;
      int1 = 0;
      if (*pxVar3 != ';') {
        iVar4 = 0;
        int1 = 0;
        do {
          if (1 < ctxt->disableSAX) break;
          if (iVar4 < 0x15) {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar4 = 0;
            if (((pxVar2->flags & 0x40) == 0) &&
               (iVar4 = 0, (long)pxVar2->end - (long)pxVar3 < 0xfa)) {
              xmlParserGrow(ctxt);
              pxVar2 = ctxt->input;
            }
          }
          bVar1 = *pxVar2->cur;
          if ((byte)(bVar1 - 0x30) < 10) {
            int1 = (int1 * 0x10 + (uint)bVar1) - 0x30;
          }
          else if (bVar1 < 0x61) {
            if (((bVar1 < 0x41) || (0x46 < bVar1)) || (0x13 < iVar4)) goto LAB_001301e2;
            int1 = (int1 * 0x10 + (uint)bVar1) - 0x37;
          }
          else {
            if ((0x66 < bVar1) || (0x13 < iVar4)) {
LAB_001301e2:
              int1 = 0;
              xmlFatalErr(ctxt,XML_ERR_INVALID_HEX_CHARREF,(char *)0x0);
              pxVar2 = ctxt->input;
              break;
            }
            int1 = (int1 * 0x10 + (uint)bVar1) - 0x57;
          }
          if (0x10ffff < (int)int1) {
            int1 = 0x110000;
          }
          xmlNextChar(ctxt);
          iVar4 = iVar4 + 1;
          pxVar2 = ctxt->input;
          pxVar3 = pxVar2->cur;
        } while (*pxVar3 != ';');
      }
      pxVar3 = pxVar2->cur;
      if (*pxVar3 == ';') goto LAB_00130201;
    }
    else {
      pxVar2->cur = pxVar3 + 2;
      pxVar2->col = pxVar2->col + 2;
      if (pxVar3[2] == '\0') {
        xmlParserGrow(ctxt);
        pxVar2 = ctxt->input;
      }
      if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar2 = ctxt->input;
      }
      pxVar3 = pxVar2->cur;
      int1 = 0;
      if (*pxVar3 != ';') {
        iVar4 = 0;
        int1 = 0;
        do {
          if (iVar4 < 0x15) {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar4 = 0;
            if (((pxVar2->flags & 0x40) == 0) &&
               (iVar4 = 0, (long)pxVar2->end - (long)pxVar3 < 0xfa)) {
              xmlParserGrow(ctxt);
              pxVar2 = ctxt->input;
            }
          }
          if (9 < (byte)(*pxVar2->cur - 0x30)) {
            int1 = 0;
            xmlFatalErr(ctxt,XML_ERR_INVALID_DEC_CHARREF,(char *)0x0);
            pxVar2 = ctxt->input;
            pxVar3 = pxVar2->cur;
            if (*pxVar3 != ';') goto LAB_001300ab;
            break;
          }
          int1 = ((uint)*pxVar2->cur + int1 * 10) - 0x30;
          if (0x10ffff < (int)int1) {
            int1 = 0x110000;
          }
          xmlNextChar(ctxt);
          iVar4 = iVar4 + 1;
          pxVar2 = ctxt->input;
          pxVar3 = pxVar2->cur;
        } while (*pxVar3 != ';');
      }
LAB_00130201:
      pxVar2->col = pxVar2->col + 1;
      pxVar2->cur = pxVar3 + 1;
    }
    if (0x10ffff < (int)int1) {
      msg = "xmlParseCharRef: character reference out of bounds\n";
      goto LAB_001300b7;
    }
    if ((int)int1 < 0x100) {
      if (0x1f < (int)int1) {
        return int1;
      }
      if ((int1 < 0xe) && ((0x2600U >> (int1 & 0x1f) & 1) != 0)) {
        return int1;
      }
    }
    else if (int1 - 0x10000 < 0xffffd800 || int1 - 0xe000 < 0x1ffe) {
      return int1;
    }
  }
  else {
LAB_00130099:
    int1 = 0;
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
  }
LAB_001300ab:
  msg = "xmlParseCharRef: invalid xmlChar value %d\n";
LAB_001300b7:
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,(xmlChar *)0x0,
             (xmlChar *)0x0,(xmlChar *)0x0,int1,msg,int1);
  return 0;
}

Assistant:

int
xmlParseCharRef(xmlParserCtxtPtr ctxt) {
    int val = 0;
    int count = 0;

    /*
     * Using RAW/CUR/NEXT is okay since we are working on ASCII range here
     */
    if ((RAW == '&') && (NXT(1) == '#') &&
        (NXT(2) == 'x')) {
	SKIP(3);
	GROW;
	while ((RAW != ';') && (PARSER_STOPPED(ctxt) == 0)) {
	    if (count++ > 20) {
		count = 0;
		GROW;
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 16 + (CUR - '0');
	    else if ((RAW >= 'a') && (RAW <= 'f') && (count < 20))
	        val = val * 16 + (CUR - 'a') + 10;
	    else if ((RAW >= 'A') && (RAW <= 'F') && (count < 20))
	        val = val * 16 + (CUR - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else if  ((RAW == '&') && (NXT(1) == '#')) {
	SKIP(2);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 10 + (CUR - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else {
        if (RAW == '&')
            SKIP(1);
        xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
    }

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseCharRef: character reference out of bounds\n",
	        val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseCharRef: invalid xmlChar value %d\n",
	                  val);
    }
    return(0);
}